

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O3

void free_filters(rar5 *rar)

{
  uint16_t uVar1;
  ushort uVar2;
  void *__ptr;
  
  uVar1 = (rar->cstate).filters.size;
  while (uVar1 != 0) {
    uVar2 = (rar->cstate).filters.beg_pos;
    __ptr = (void *)(rar->cstate).filters.arr[uVar2];
    (rar->cstate).filters.beg_pos = uVar2 + 1 & (rar->cstate).filters.cap_mask;
    (rar->cstate).filters.size = uVar1 - 1;
    free(__ptr);
    uVar1 = (rar->cstate).filters.size;
  }
  (rar->cstate).filters.size = 0;
  (rar->cstate).filters.beg_pos = 0;
  (rar->cstate).filters.end_pos = 0;
  (rar->cstate).last_block_start = 0;
  (rar->cstate).last_block_length = 0;
  return;
}

Assistant:

static void free_filters(struct rar5* rar) {
	struct cdeque* d = &rar->cstate.filters;

	/* Free any remaining filters. All filters should be naturally
	 * consumed by the unpacking function, so remaining filters after
	 * unpacking normally mean that unpacking wasn't successful.
	 * But still of course we shouldn't leak memory in such case. */

	/* cdeque_size() is a fast operation, so we can use it as a loop
	 * expression. */
	while(cdeque_size(d) > 0) {
		struct filter_info* f = NULL;

		/* Pop_front will also decrease the collection's size. */
		if (CDE_OK == cdeque_pop_front(d, cdeque_filter_p(&f)))
			free(f);
	}

	cdeque_clear(d);

	/* Also clear out the variables needed for sanity checking. */
	rar->cstate.last_block_start = 0;
	rar->cstate.last_block_length = 0;
}